

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync_decoder_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceSyncDecoderTest_TestDecodingACompressedMessage_Test::
~PriceSyncDecoderTest_TestDecodingACompressedMessage_Test
          (PriceSyncDecoderTest_TestDecodingACompressedMessage_Test *this)

{
  PriceSyncDecoderTest::~PriceSyncDecoderTest(&this->super_PriceSyncDecoderTest);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_F(PriceSyncDecoderTest, TestDecodingACompressedMessage)
{
    ByteBuffer buffer = BufferUtil::HexBuffer("500103858afa8ee82c6337034a636061b0ffc100068c108a7b0793fd8f351c866a2f2b996122698c40655fb7b92e3c75a019aa8cfd0293fdd7eb5cb6058baf33c344d29858181c18c358242697ec812a139cc2e4c058f5d07d9d4835334c04000000ffff");
    EXPECT_EQ('P', buffer.ReadByte());
    PriceSync price_sync = decoder.DecodePriceSync(buffer);
    EXPECT_EQ(3, price_sync.GetRevision());
    EXPECT_EQ(1539777135877, price_sync.GetRevisionTime());
    EXPECT_EQ(99, price_sync.GetConflationLatency());
    EXPECT_EQ(55, price_sync.GetEdition());
    EXPECT_EQ(3, price_sync.GetSize());
    EXPECT_TRUE(price_sync.IsCompressed());

    std::deque<std::shared_ptr<PriceEvent>> events;
    auto syncable = QueueingPriceSyncListener(&events);
    price_sync.Visit(data_dictionary, syncable);

    ASSERT_FALSE(events.empty());

    std::shared_ptr<PriceEvent> event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected1;
    expected1.emplace("Ask", PriceField(1.542));
    expected1.emplace("AskSize", PriceField(3000));
    expected1.emplace("Bid", PriceField(1.5));
    expected1.emplace("BidSize", PriceField(3000));
    EXPECT_EQ(0, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected1, *event);

    event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected2;
    expected2.emplace("Ask", PriceField(1.365));
    expected2.emplace("AskSize", PriceField(2000));
    expected2.emplace("Bid", PriceField(1.357));
    expected2.emplace("BidSize", PriceField(2000));
    EXPECT_EQ(1, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected2, *event);

    event = events.front();
    events.pop_front();
    std::map<std::string, PriceField> expected3;
    expected3.emplace("Ask", PriceField(2.185));
    expected3.emplace("AskSize", PriceField(4500));
    expected3.emplace("Bid", PriceField(2.167));
    expected3.emplace("BidSize", PriceField(4500));
    EXPECT_EQ(2, event->GetSid());
    ExpectPriceImageEvent(*event);
    ExpectPriceContains(expected3, *event);

    EXPECT_TRUE(events.empty());
}